

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *tfunction)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  t_generator::camelcase(&local_68,(t_generator *)this,&local_48);
  argument_list_abi_cxx11_(&local_88,this,tfunction->arglist_);
  _Var4._M_p = local_88._M_dataplus._M_p;
  paVar2 = &local_88.field_2;
  iVar6 = toupper((int)*local_88._M_dataplus._M_p);
  sVar5 = local_88._M_string_length;
  *_Var4._M_p = (char)iVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar2) {
    local_98._8_8_ = local_88.field_2._8_8_;
    local_a8 = &local_98;
  }
  else {
    local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
  }
  local_98._M_allocated_capacity._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
  local_98._M_local_buf[0] = local_88.field_2._M_local_buf[0];
  local_a0 = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    uVar8 = local_68.field_2._M_allocated_capacity;
  }
  local_88._M_dataplus._M_p = (pointer)paVar2;
  if ((ulong)uVar8 < local_68._M_string_length + sVar5) {
    uVar8 = 0xf;
    if (local_a8 != &local_98) {
      uVar8 = local_98._M_allocated_capacity;
    }
    if (local_68._M_string_length + sVar5 <= (ulong)uVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a8,0,(char *)0x0,(ulong)local_68._M_dataplus._M_p);
      goto LAB_0034f14a;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8);
LAB_0034f14a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar8 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_signature(t_function* tfunction) {
  return camelcase(tfunction->get_name()) + capitalize(argument_list(tfunction->get_arglist()));
}